

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void par_shapes_merge_and_free(par_shapes_mesh *dst,par_shapes_mesh *src)

{
  uint uVar1;
  int iVar2;
  uint16_t *puVar3;
  float *pfVar4;
  uint16_t *puVar5;
  long lVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  
  uVar1 = dst->npoints;
  iVar8 = src->npoints + uVar1;
  pfVar4 = (float *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->points,
                                       iVar8 * 0xc,uVar1 * 3);
  dst->points = pfVar4;
  memcpy(pfVar4 + (long)dst->npoints * 3,src->points,(long)src->npoints * 0xc);
  dst->npoints = iVar8;
  if ((src->normals != (float *)0x0) || (dst->normals != (float *)0x0)) {
    pfVar4 = (float *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->normals,
                                         iVar8 * 0xc,uVar1 * 3);
    dst->normals = pfVar4;
    if (src->normals != (float *)0x0) {
      memcpy((void *)((long)pfVar4 + (ulong)((uVar1 & 0xffff) * 0xc)),src->normals,
             (long)src->npoints * 0xc);
    }
  }
  if ((src->tcoords != (float *)0x0) || (dst->tcoords != (float *)0x0)) {
    pfVar4 = (float *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->tcoords,
                                         iVar8 * 8,uVar1 * 2);
    dst->tcoords = pfVar4;
    if (src->tcoords != (float *)0x0) {
      memcpy(pfVar4 + (uVar1 * 2 & 0x1fffe),src->tcoords,(long)src->npoints << 3);
    }
  }
  iVar9 = src->ntriangles + dst->ntriangles;
  puVar5 = (uint16_t *)
           rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->triangles,iVar9 * 6,
                              dst->ntriangles * 3);
  dst->triangles = puVar5;
  iVar8 = src->ntriangles;
  if (0 < iVar8) {
    puVar3 = src->triangles;
    iVar2 = dst->ntriangles;
    lVar6 = 0;
    do {
      sVar7 = (short)uVar1;
      *(short *)((long)puVar5 + lVar6 + (long)(iVar2 * 3) * 2) =
           *(short *)((long)puVar3 + lVar6) + sVar7;
      *(short *)((long)puVar5 + lVar6 + (long)(iVar2 * 3) * 2 + 2) =
           *(short *)((long)puVar3 + lVar6 + 2) + sVar7;
      *(short *)((long)puVar5 + lVar6 + (long)(iVar2 * 3) * 2 + 4) =
           *(short *)((long)puVar3 + lVar6 + 4) + sVar7;
      lVar6 = lVar6 + 6;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  dst->ntriangles = iVar9;
  par_shapes_free_mesh(src);
  return;
}

Assistant:

PARDEF void par_shapes_merge_and_free(par_shapes_mesh* dst, par_shapes_mesh* src)
{
    par_shapes_merge(dst, src);
    par_shapes_free_mesh(src);
}